

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O1

Bool AfterSpaceImp(Lexer *lexer,Node *node,Bool isEmpty)

{
  Node *node_00;
  Bool BVar1;
  
  while( true ) {
    BVar1 = prvTidynodeCMIsInline(node);
    if (BVar1 == no) {
      return yes;
    }
    node_00 = node->prev;
    if (node_00 != (Node *)0x0) break;
    if ((isEmpty != no) && (BVar1 = prvTidynodeCMIsInline(node->parent), BVar1 == no)) {
      return no;
    }
    node = node->parent;
  }
  BVar1 = prvTidynodeIsText(node_00);
  if (BVar1 != no) {
    BVar1 = prvTidyTextNodeEndWithSpace(lexer,node_00);
    return BVar1;
  }
  if ((node_00->tag != (Dict *)0x0) && (node_00->tag->id == TidyTag_BR)) {
    return yes;
  }
  return no;
}

Assistant:

static Bool AfterSpaceImp(Lexer *lexer, Node *node, Bool isEmpty)
{
    Node *prev;

    if ( !TY_(nodeCMIsInline)(node) )
        return yes;

    prev = node->prev;
    if (prev)
    {
        if (TY_(nodeIsText)(prev))
            return TY_(TextNodeEndWithSpace)( lexer, prev );
        else if (nodeIsBR(prev))
            return yes;

        return no;
    }

    if ( isEmpty && !TY_(nodeCMIsInline)(node->parent) )
        return no;

    return AfterSpaceImp(lexer, node->parent, isEmpty);
}